

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluTextureTestUtil.cpp
# Opt level: O1

float glu::TextureTestUtil::computeLodFromDerivates
                (LodMode mode,float dudx,float dvdx,float dudy,float dvdy)

{
  uint uVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  
  if (mode - LODMODE_MIN_BOUND < 2) {
    uVar1 = -(uint)(-dudx <= dudx);
    fVar2 = (float)(uVar1 & (uint)dudx | ~uVar1 & (uint)-dudx);
    uVar1 = -(uint)(-dudy <= dudy);
    fVar3 = (float)(uVar1 & (uint)dudy | ~uVar1 & (uint)-dudy);
    uVar1 = -(uint)(fVar3 <= fVar2);
    fVar2 = (float)(~uVar1 & (uint)fVar3 | uVar1 & (uint)fVar2);
    uVar1 = -(uint)(-dvdx <= dvdx);
    fVar3 = (float)(uVar1 & (uint)dvdx | ~uVar1 & (uint)-dvdx);
    uVar1 = -(uint)(-dvdy <= dvdy);
    fVar4 = (float)(uVar1 & (uint)dvdy | ~uVar1 & (uint)-dvdy);
    uVar1 = -(uint)(fVar4 <= fVar3);
    fVar3 = (float)(~uVar1 & (uint)fVar4 | uVar1 & (uint)fVar3);
    if (mode == LODMODE_MIN_BOUND) {
      fVar2 = (float)(~-(uint)(fVar3 <= fVar2) & (uint)fVar3 | -(uint)(fVar3 <= fVar2) & (uint)fVar2
                     );
    }
    else {
      fVar2 = fVar2 + fVar3;
    }
  }
  else {
    fVar2 = 0.0;
    if (mode == LODMODE_EXACT) {
      fVar2 = dudx * dudx + dvdx * dvdx;
      if (fVar2 < 0.0) {
        fVar2 = sqrtf(fVar2);
      }
      else {
        fVar2 = SQRT(fVar2);
      }
      fVar3 = dudy * dudy + dvdy * dvdy;
      if (fVar3 < 0.0) {
        fVar3 = sqrtf(fVar3);
      }
      else {
        fVar3 = SQRT(fVar3);
      }
      fVar2 = (float)(~-(uint)(fVar3 <= fVar2) & (uint)fVar3 | (uint)fVar2 & -(uint)(fVar3 <= fVar2)
                     );
    }
  }
  fVar2 = logf(fVar2);
  return fVar2 * 1.442695;
}

Assistant:

float computeLodFromDerivates (LodMode mode, float dudx, float dvdx, float dudy, float dvdy)
{
	float p = 0.0f;
	switch (mode)
	{
		case LODMODE_EXACT:
			p = de::max(deFloatSqrt(dudx*dudx + dvdx*dvdx), deFloatSqrt(dudy*dudy + dvdy*dvdy));
			break;

		case LODMODE_MIN_BOUND:
		case LODMODE_MAX_BOUND:
		{
			float mu = de::max(deFloatAbs(dudx), deFloatAbs(dudy));
			float mv = de::max(deFloatAbs(dvdx), deFloatAbs(dvdy));

			p = mode == LODMODE_MIN_BOUND ? de::max(mu, mv) : mu + mv;
			break;
		}

		default:
			DE_ASSERT(DE_FALSE);
	}

	return deFloatLog2(p);
}